

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcf_re_range(mpc_val_t *x)

{
  char cVar1;
  char cVar2;
  char *s;
  mpc_parser_t *pmVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char *__s;
  
  cVar1 = *x;
  s = (char *)calloc(1,1);
  cVar2 = cVar1;
  if (cVar1 == '^') {
    cVar2 = *(char *)((long)x + 1);
  }
  if (cVar2 == '\0') {
    free(s);
    free(x);
    pmVar3 = mpc_fail("Invalid Regex Range Expression");
    return pmVar3;
  }
  uVar7 = (ulong)(cVar1 == '^');
  do {
    sVar4 = strlen((char *)x);
    if (sVar4 <= uVar7) {
      if (cVar1 == '^') {
        pmVar3 = mpc_noneof(s);
      }
      else {
        pmVar3 = mpc_oneof(s);
      }
      free(x);
      free(s);
      return pmVar3;
    }
    if (*(char *)((long)x + uVar7) == '-') {
      lVar8 = (long)*(char *)((long)x + uVar7 + 1);
      if (uVar7 == 0 || lVar8 == 0) {
        sVar4 = strlen(s);
        s = (char *)realloc(s,sVar4 + 2);
        sVar4 = strlen(s);
        (s + sVar4)[0] = '-';
        (s + sVar4)[1] = '\0';
      }
      else {
        uVar6 = (ulong)*(char *)((long)x + (uVar7 - 1));
        while (uVar6 = uVar6 + 1, uVar6 <= lVar8 - 1U) {
          sVar4 = strlen(s);
          s = (char *)realloc(s,sVar4 + 3);
          sVar4 = strlen(s);
          s[sVar4 + 1] = '\0';
          sVar4 = strlen(s);
          s[sVar4] = (char)uVar6;
        }
      }
    }
    else if (*(char *)((long)x + uVar7) == '\\') {
      cVar2 = *(char *)((long)x + uVar7 + 1);
      uVar7 = uVar7 + 1;
      switch(cVar2) {
      case 'a':
        __s = "\a";
        break;
      case 'b':
        __s = "\b";
        break;
      case 'c':
      case 'e':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'o':
      case 'p':
      case 'q':
      case 'u':
        goto switchD_001b0872_caseD_63;
      case 'd':
        __s = "0123456789";
        break;
      case 'f':
        __s = "\f";
        break;
      case 'n':
        __s = "\n";
        break;
      case 'r':
        __s = "\r";
        break;
      case 's':
        __s = " \f\n\r\t\v";
        break;
      case 't':
        __s = "\t";
        break;
      case 'v':
        __s = "\v";
        break;
      case 'w':
        __s = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_";
        break;
      default:
        __s = "-";
        if (cVar2 != '-') goto switchD_001b0872_caseD_63;
      }
      sVar4 = strlen(s);
      sVar5 = strlen(__s);
      s = (char *)realloc(s,sVar4 + sVar5 + 1);
      strcat(s,__s);
    }
    else {
switchD_001b0872_caseD_63:
      sVar4 = strlen(s);
      s = (char *)realloc(s,sVar4 + 2);
      sVar4 = strlen(s);
      s[sVar4 + 1] = '\0';
      cVar2 = *(char *)((long)x + uVar7);
      sVar4 = strlen(s);
      s[sVar4] = cVar2;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static mpc_val_t *mpcf_re_range(mpc_val_t *x) {

  mpc_parser_t *out;
  size_t i, j;
  size_t start, end;
  const char *tmp = NULL;
  const char *s = x;
  int comp = s[0] == '^' ? 1 : 0;
  char *range = calloc(1,1);

  if (s[0] == '\0') { free(range); free(x); return mpc_fail("Invalid Regex Range Expression"); }
  if (s[0] == '^' &&
      s[1] == '\0') { free(range); free(x); return mpc_fail("Invalid Regex Range Expression"); }

  for (i = comp; i < strlen(s); i++){

    /* Regex Range Escape */
    if (s[i] == '\\') {
      tmp = mpc_re_range_escape_char(s[i+1]);
      if (tmp != NULL) {
        range = realloc(range, strlen(range) + strlen(tmp) + 1);
        strcat(range, tmp);
      } else {
        range = realloc(range, strlen(range) + 1 + 1);
        range[strlen(range) + 1] = '\0';
        range[strlen(range) + 0] = s[i+1];
      }
      i++;
    }

    /* Regex Range...Range */
    else if (s[i] == '-') {
      if (s[i+1] == '\0' || i == 0) {
          range = realloc(range, strlen(range) + strlen("-") + 1);
          strcat(range, "-");
      } else {
        start = s[i-1]+1;
        end = s[i+1]-1;
        for (j = start; j <= end; j++) {
          range = realloc(range, strlen(range) + 1 + 1 + 1);
          range[strlen(range) + 1] = '\0';
          range[strlen(range) + 0] = (char)j;
        }
      }
    }

    /* Regex Range Normal */
    else {
      range = realloc(range, strlen(range) + 1 + 1);
      range[strlen(range) + 1] = '\0';
      range[strlen(range) + 0] = s[i];
    }

  }

  out = comp == 1 ? mpc_noneof(range) : mpc_oneof(range);

  free(x);
  free(range);

  return out;
}